

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O1

void __thiscall
estl::vector_s<std::__cxx11::string,12ul>::vector_s<10ul>
          (vector_s<std::__cxx11::string,12ul> *this,
          vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
          *other)

{
  long *plVar1;
  long lVar2;
  pointer pvVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  size_type sVar7;
  
  *(undefined8 *)this = 0;
  *(vector_s<std::__cxx11::string,12ul> **)(this + 0x188) = this + 8;
  sVar7 = other->size_;
  if (sVar7 != 0) {
    lVar6 = sVar7 << 5;
    do {
      lVar5 = lVar6 + -0x20;
      lVar2 = *(long *)(this + 0x188);
      pvVar3 = other->data_ptr_;
      plVar1 = (long *)(lVar2 + lVar5);
      *plVar1 = (long)(plVar1 + 2);
      lVar4 = *(long *)((long)&pvVar3[-1]._M_dataplus._M_p + lVar6);
      std::__cxx11::string::_M_construct<char*>
                ((string *)(lVar2 + lVar5),lVar4,
                 *(long *)((long)&pvVar3[-1]._M_string_length + lVar6) + lVar4);
      sVar7 = sVar7 - 1;
      lVar6 = lVar5;
    } while (sVar7 != 0);
  }
  *(size_type *)this = other->size_;
  return;
}

Assistant:

vector_s(const vector_s<T, CAPACITY_OTHER>& other)
    {
        for (size_type i = other.size(); i > 0; ) {
            --i;
            const pointer insert_ptr = data_ptr_ + i;
            new (insert_ptr) value_type(other[i]);
        }
        size_ = other.size();
    }